

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_string *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  Property *prop;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar1;
  size_type *psVar2;
  undefined8 uVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  long *plVar12;
  anon_struct_8_0_00000001_for___align *paVar13;
  _Base_ptr p_Var14;
  Property *args;
  size_type __n;
  anon_struct_8_0_00000001_for___align prop_00;
  anon_struct_8_0_00000001_for___align args_2;
  _Base_ptr __k;
  ParseResult sret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ParseResult ret;
  ostringstream ss_e;
  _Alloc_hider in_stack_fffffffffffffa48;
  _Alloc_hider local_5b0;
  undefined1 local_5a8 [24];
  undefined1 local_590 [16];
  anon_struct_8_0_00000001_for___align local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_578;
  undefined1 local_568 [48];
  key_type local_538;
  storage_t<double> local_518;
  UsdPrimvarReader_string *local_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [56];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4c0;
  undefined1 local_4b8 [32];
  long local_498 [2];
  string local_488 [16];
  undefined8 local_478 [2];
  undefined1 local_468 [32];
  string local_448 [16];
  long local_438 [2];
  undefined1 local_428 [8];
  undefined8 local_420;
  undefined1 local_418 [96];
  ios_base local_3b8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined8 local_290;
  _Alloc_hider _Stack_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  storage_union sStack_268;
  vtable_type *local_258;
  undefined8 uStack_250;
  pointer local_248;
  pointer pSStack_240;
  pointer local_238;
  undefined8 uStack_230;
  undefined1 local_228;
  pointer local_220;
  undefined1 local_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  undefined8 local_200;
  optional<tinyusdz::value::StringData> oStack_1f8;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1c0;
  optional<double> local_188;
  optional<tinyusdz::Token> local_178;
  optional<tinyusdz::Token> local_150;
  optional<tinyusdz::Token> local_128;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_100;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined1 local_a0 [32];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [8];
  optional<tinyusdz::Token> oStack_78;
  undefined8 uStack_50;
  undefined1 uStack_48;
  undefined7 local_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  local_4f8._24_8_ = (long)local_4f8 + 8;
  local_4f8._8_4_ = 0;
  local_4f8._16_8_ = (_Link_type)0x0;
  local_4f8._40_8_ = 0;
  local_508._8_8_ = warn;
  local_4f8._32_8_ = local_4f8._24_8_;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_4f8,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                             local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4b8._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar5 = true;
  if (p_Var14 != (_Base_ptr)local_4b8._8_8_) {
    local_4b8._0_8_ = &preader->fallback;
    local_508._0_8_ = &preader->varname;
    local_518 = (storage_t<double>)&preader->result;
    local_4f8._48_8_ = &(preader->result)._actual_type_name;
    local_4c0 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_568._40_8_ = err;
    local_510 = preader;
    do {
      local_448._0_8_ = local_438;
      ::std::__cxx11::string::_M_construct<char*>
                (local_448,*(long *)(p_Var14 + 1),
                 (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
      prop = (Property *)(p_Var14 + 2);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"inputs:fallback","");
      prop_00 = (anon_struct_8_0_00000001_for___align)&local_2b0;
      args_2 = (anon_struct_8_0_00000001_for___align)local_4b8._0_8_;
      (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                ((ParseResult *)local_428,(_anonymous_namespace_ *)local_4f8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_448,(string *)prop,(Property *)&local_2b0,(string *)local_4b8._0_8_,
                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa48._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,
                        CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                                 local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((long *)local_448._0_8_ != local_438) {
        operator_delete((void *)local_448._0_8_,local_438[0] + 1);
      }
      iVar6 = 0;
      if (((ulong)local_428 & 0xfffffffd) == 0) {
        iVar6 = 3;
LAB_0023aabc:
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if (local_428._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(&local_2b0,0x112a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          local_590._0_8_ = &local_580;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)&stack0xfffffffffffffa48,(fmt *)local_590,(string *)"inputs:fallback"
                     ,(char (*) [16])&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_2b0,in_stack_fffffffffffffa48._M_p,
                              (long)local_5b0._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa48._M_p !=
              (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5a8) {
            operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
          }
          uVar3 = local_568._40_8_;
          if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
            operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
          }
          if ((string *)uVar3 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar9 = (long *)::std::__cxx11::string::_M_append(local_590,*(ulong *)uVar3);
            pTVar1 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(plVar9 + 2);
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)*plVar9 == pTVar1) {
              local_5a8._0_8_ = (pTVar1->_metas).interpolation;
              local_5a8._8_8_ = plVar9[3];
              in_stack_fffffffffffffa48._M_p = (pointer)local_5a8;
            }
            else {
              local_5a8._0_8_ = (pTVar1->_metas).interpolation;
              in_stack_fffffffffffffa48._M_p = (pointer)*plVar9;
            }
            local_5b0._M_p = (pointer)plVar9[1];
            *plVar9 = (long)pTVar1;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)uVar3,(string *)&stack0xfffffffffffffa48);
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa48._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5a8) {
              operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
            }
            if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
              operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          iVar6 = 1;
          goto LAB_0023aabc;
        }
      }
      if ((undefined1 *)local_420 != local_418 + 8) {
        operator_delete((void *)local_420,local_418._8_8_ + 1);
      }
      if (bVar5) {
        __k = p_Var14 + 1;
        iVar6 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar6 == 0) {
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b0,"inputs:varname","");
          cVar10 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f8,&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,
                            CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                                     local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
          }
          if (cVar10._M_node == (_Base_ptr)(local_4f8 + 8)) {
            local_2b0._M_dataplus._M_p =
                 (pointer)(((ulong)local_2b0._M_dataplus._M_p >> 8 & 0xffffff) << 8);
            local_2b0._M_string_length._0_4_ = (uint)local_2b0._M_string_length & 0xffffff00;
            local_2b0._M_string_length._4_4_ = 0;
            local_2b0.field_2._M_allocated_capacity._0_2_ = 0;
            local_2b0.field_2._M_local_buf[8] = '\0';
            local_220 = (pointer)0x0;
            local_218 = 0;
            local_100.has_value_ = false;
            local_100._1_7_ = 0;
            local_100.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_128.contained._16_8_ = 0;
            local_128.contained._24_8_ = 0;
            local_100.contained._16_4_ = 0;
            local_100.contained._24_8_ = 0;
            sStack_268._8_1_ = 0;
            aStack_278._8_8_ = 0;
            sStack_268.dynamic = (void *)0x0;
            local_280 = 0;
            aStack_278._M_allocated_capacity = 0;
            local_290._0_4_ = Varying;
            local_290._4_1_ = false;
            local_290._5_3_ = 0;
            _Stack_288._M_p = (pointer)0x0;
            local_228 = 0;
            local_238 = (pointer)0x0;
            uStack_230._0_1_ = false;
            uStack_230._1_7_ = 0;
            local_248 = (pointer)0x0;
            pSStack_240 = (pointer)0x0;
            local_258 = (vtable_type *)0x0;
            uStack_250._0_1_ = false;
            uStack_250._1_7_ = 0;
            oStack_1f8.contained._0_1_ = 0;
            local_200._0_1_ = false;
            local_200._1_1_ = (storage_t<bool>)0x0;
            local_200._2_6_ = 0;
            oStack_1f8.has_value_ = false;
            oStack_1f8._1_7_ = 0;
            local_210.has_value_ = false;
            local_210._1_3_ = 0;
            local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            oStack_208.has_value_ = false;
            oStack_208._1_3_ = 0;
            oStack_208.contained = (storage_t<unsigned_int>)0x0;
            oStack_1f8.contained._40_1_ = 0;
            oStack_1f8.contained._24_8_ = 0;
            oStack_1f8.contained._32_8_ = 0;
            oStack_1f8.contained._8_8_ = 0;
            oStack_1f8.contained._16_8_ = 0;
            local_1c0.contained._24_1_ = 0;
            local_1c0.contained._8_8_ = 0;
            local_1c0.contained._16_8_ = 0;
            local_1c0.has_value_ = false;
            local_1c0._1_7_ = 0;
            local_1c0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_178.contained._8_1_ = 0;
            local_178.has_value_ = false;
            local_178._1_7_ = 0;
            local_178.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_188.has_value_ = false;
            local_188._1_7_ = 0;
            local_188.contained = (storage_t<double>)0x0;
            local_1c0.contained._32_8_ = 0;
            local_1c0.contained._40_8_ = 0;
            local_150.contained._8_1_ = 0;
            local_150.has_value_ = false;
            local_150._1_7_ = 0;
            local_150.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_178.contained._16_8_ = 0;
            local_178.contained._24_8_ = 0;
            local_128.contained._8_1_ = 0;
            local_128.has_value_ = false;
            local_128._1_7_ = 0;
            local_128.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_150.contained._16_8_ = 0;
            local_150.contained._24_8_ = 0;
            local_100.contained._32_8_ = (long)&local_100.contained + 0x10;
            local_c8.contained._24_1_ = 0;
            local_c8.contained._8_8_ = 0;
            local_c8.contained._16_8_ = 0;
            local_c8.has_value_ = false;
            local_c8._1_7_ = 0;
            local_c8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_a0[0x10] = 0;
            local_a0._17_8_ = 0;
            local_a0._0_8_ = (pointer)0x0;
            local_a0[8] = 0;
            local_a0._9_7_ = 0;
            uStack_40 = 0;
            uStack_3f = 0;
            uStack_50 = 0;
            uStack_48 = _S_red;
            local_47 = 0;
            oStack_78.contained._16_8_ = 0;
            oStack_78.contained._24_8_ = 0;
            oStack_78.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            oStack_78.contained._8_8_ = 0;
            local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            oStack_78.has_value_ = false;
            oStack_78._1_7_ = 0;
            local_468._0_8_ = local_468 + 0x10;
            local_568._32_8_ = __k;
            local_100.contained._40_8_ = local_100.contained._32_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_468,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            prop_00 = (anon_struct_8_0_00000001_for___align)local_428;
            local_428 = (undefined1  [8])local_418;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","")
            ;
            args_2 = (anon_struct_8_0_00000001_for___align)&local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)&stack0xfffffffffffffa48,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4f8,(string *)local_468,prop,(string *)prop_00,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_2b0);
            if (local_428 != (undefined1  [8])local_418) {
              operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
            }
            if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
              operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
            }
            __k = (_Base_ptr)local_568._32_8_;
            if ((ResultCode)in_stack_fffffffffffffa48._M_p == TypeMismatch) {
              local_488._0_8_ = local_478;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_488,*(long *)(p_Var14 + 1),
                         (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
              prop_00 = (anon_struct_8_0_00000001_for___align)local_428;
              local_428 = (undefined1  [8])local_418;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)prop_00,"inputs:varname","");
              args = prop;
              args_2 = (anon_struct_8_0_00000001_for___align)local_508._0_8_;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_590,(_anonymous_namespace_ *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_488,(string *)prop,(Property *)prop_00,(string *)local_508._0_8_,
                         (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffa48._M_p);
              if (local_428 != (undefined1  [8])local_418) {
                operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
              }
              uVar3 = local_568._40_8_;
              if ((undefined8 *)local_488._0_8_ != local_478) {
                operator_delete((void *)local_488._0_8_,local_478[0] + 1);
              }
              if (local_590._0_4_ == Success) {
                iVar6 = 3;
                __k = (_Base_ptr)local_568._32_8_;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_428,0x1143);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_538,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_568,(fmt *)&local_538,(string *)(local_590 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_428,(char *)local_568._0_8_,local_568._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
                  operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538._M_dataplus._M_p != &local_538.field_2) {
                  operator_delete(local_538._M_dataplus._M_p,
                                  local_538.field_2._M_allocated_capacity + 1);
                }
                __k = (_Base_ptr)local_568._32_8_;
                if ((string *)uVar3 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_538,*(ulong *)uVar3);
                  psVar2 = (size_type *)(plVar9 + 2);
                  if ((size_type *)*plVar9 == psVar2) {
                    local_568._16_8_ = *psVar2;
                    local_568._24_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar9 + 3);
                    local_568._0_8_ = local_568 + 0x10;
                  }
                  else {
                    local_568._16_8_ = *psVar2;
                    local_568._0_8_ = (size_type *)*plVar9;
                  }
                  local_568._8_8_ = plVar9[1];
                  *plVar9 = (long)psVar2;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)uVar3,(string *)local_568);
                  __k = (_Base_ptr)local_568._32_8_;
                  if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
                    operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_538._M_dataplus._M_p != &local_538.field_2) {
                    operator_delete(local_538._M_dataplus._M_p,
                                    local_538.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
                ::std::ios_base::~ios_base(local_3b8);
                iVar6 = 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_590._8_8_ != &aStack_578) {
                operator_delete((void *)local_590._8_8_,aStack_578._M_allocated_capacity + 1);
              }
            }
            else {
              iVar6 = 0;
              if ((ResultCode)in_stack_fffffffffffffa48._M_p == Success) {
                bVar5 = ConvertTokenAttributeToStringAttribute
                                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                   &local_2b0,
                                   (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_508._0_8_);
                iVar6 = 3;
                if (!bVar5) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_428,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_428,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_428,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_428,0x1131);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_428,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"\n",1);
                  uVar3 = local_568._40_8_;
                  if ((string *)local_568._40_8_ != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar9 = (long *)::std::__cxx11::string::_M_append(local_568,*(ulong *)uVar3);
                    paVar13 = (anon_struct_8_0_00000001_for___align *)(plVar9 + 2);
                    if ((anon_struct_8_0_00000001_for___align *)*plVar9 == paVar13) {
                      local_580 = *paVar13;
                      aStack_578._M_allocated_capacity = plVar9[3];
                      local_590._0_8_ = &local_580;
                    }
                    else {
                      local_580 = *paVar13;
                      local_590._0_8_ = (anon_struct_8_0_00000001_for___align *)*plVar9;
                    }
                    local_590._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar9 + 1);
                    *plVar9 = (long)paVar13;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)uVar3,(string *)local_590);
                    __k = (_Base_ptr)local_568._32_8_;
                    if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
                      operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
                    }
                    if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
                      operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
                  ::std::ios_base::~ios_base(local_3b8);
                  iVar6 = 1;
                }
              }
            }
            if (local_5b0._M_p != local_5a8 + 8) {
              operator_delete(local_5b0._M_p,local_5a8._8_8_ + 1);
            }
            if (local_a0[0x18] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value(local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
            AttrMetas::~AttrMetas((AttrMetas *)&local_2b0);
            if (iVar6 != 0) goto LAB_0023bc59;
          }
        }
        local_4b8._16_8_ = local_498;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_4b8 + 0x10),*(long *)(p_Var14 + 1),
                   (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"outputs:result","");
        uVar3 = local_4b8._24_8_;
        sVar4 = local_538._M_string_length;
        local_420 = local_418 + 8;
        local_418._0_8_ = (char *)0x0;
        local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
        __n = local_4b8._24_8_;
        if (local_538._M_string_length < (ulong)local_4b8._24_8_) {
          __n = local_538._M_string_length;
        }
        if (__n == 0) {
          if (local_4b8._24_8_ == local_538._M_string_length) goto LAB_0023ac1f;
LAB_0023ac5a:
          local_428._0_4_ = 1;
        }
        else {
          iVar6 = bcmp((void *)local_4b8._16_8_,local_538._M_dataplus._M_p,__n);
          if ((uVar3 != sVar4) || (iVar6 != 0)) goto LAB_0023ac5a;
LAB_0023ac1f:
          cVar10 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f8,&local_538);
          if (cVar10._M_node == (_Base_ptr)(local_4f8 + 8)) {
            if (*(uint *)((long)&p_Var14[0x17]._M_parent + 4) < 2) {
              bVar5 = Attribute::is_connection((Attribute *)prop);
              if (bVar5) {
                local_428._0_4_ = 5;
                prop_00 = (anon_struct_8_0_00000001_for___align)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_420,0,(char *)local_418._0_8_,0x3e1315);
              }
              else {
                if (*(int *)((long)&p_Var14[0x17]._M_parent + 4) != 0) goto LAB_0023b841;
                Attribute::type_name_abi_cxx11_(&local_2b0,(Attribute *)prop);
                bVar5 = tinyusdz::value::IsRoleType(&local_2b0);
                in_stack_fffffffffffffa48._M_p = local_5a8;
                local_5b0._M_p = (pointer)0x6;
                local_5a8._0_7_ = 0x676e69727473;
                if ((CONCAT44(local_2b0._M_string_length._4_4_,(uint)local_2b0._M_string_length) ==
                     6) && ((short)*(int *)(local_2b0._M_dataplus._M_p + 4) == 0x676e &&
                            *(int *)local_2b0._M_dataplus._M_p == 0x69727473)) {
                  (local_510->result)._authored = true;
LAB_0023bd7a:
                  AttrMetas::operator=((AttrMetas *)local_518,(AttrMetas *)(p_Var14 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_4f8,&local_538);
                  local_428 = (undefined1  [8])((ulong)local_428 & 0xffffffff00000000);
                }
                else if (bVar5) {
                  uVar7 = tinyusdz::value::GetUnderlyingTypeId(&local_2b0);
                  if (uVar7 == 7) {
                    (local_510->result)._authored = true;
                    ::std::__cxx11::string::_M_assign((string *)local_4f8._48_8_);
                    goto LAB_0023bd7a;
                  }
                  local_428._0_4_ = 3;
                  local_590._0_8_ = &local_580;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_590,
                             "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                             ,"");
                  local_568._0_8_ = local_568 + 0x10;
                  local_568._8_8_ = 6;
                  local_568._16_7_ = 0x676e69727473;
                  prop_00 = (anon_struct_8_0_00000001_for___align)&local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)&stack0xfffffffffffffa48,(fmt *)local_590,&local_538,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_568,&local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_2);
                  ::std::__cxx11::string::operator=
                            ((string *)&local_420,(string *)&stack0xfffffffffffffa48);
                  if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa48._M_p !=
                      (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5a8) {
                    operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
                  }
                  if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
                    operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
                  }
                  if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580)
                  goto LAB_0023bd5c;
                }
                else {
                  local_428._0_4_ = 3;
                  local_590._0_8_ = &local_580;
                  local_568._0_8_ = (anon_struct_8_0_00000001_for___align)0x46;
                  local_568._32_8_ = __k;
                  paVar13 = (anon_struct_8_0_00000001_for___align *)
                            ::std::__cxx11::string::_M_create((ulong *)local_590,(ulong)local_568);
                  uVar3 = local_568._0_8_;
                  local_580 = (anon_struct_8_0_00000001_for___align)local_568._0_8_;
                  local_590._0_8_ = paVar13;
                  memcpy(paVar13,
                         "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                         0x46);
                  local_590._8_8_ = uVar3;
                  *(undefined1 *)((long)&paVar13->field_0x0 + uVar3) = 0;
                  local_568._0_8_ = local_568 + 0x10;
                  local_568._8_8_ = 6;
                  local_568._16_7_ = 0x676e69727473;
                  prop_00 = (anon_struct_8_0_00000001_for___align)&local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)&stack0xfffffffffffffa48,(fmt *)local_590,&local_538,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_568,&local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_2);
                  ::std::__cxx11::string::operator=
                            ((string *)&local_420,(string *)&stack0xfffffffffffffa48);
                  if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa48._M_p !=
                      (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5a8) {
                    operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
                  }
                  __k = (_Base_ptr)local_568._32_8_;
                  if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
                    operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
                  }
                  if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
LAB_0023bd5c:
                    operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                  operator_delete(local_2b0._M_dataplus._M_p,
                                  CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                                           local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
                }
              }
            }
            else {
LAB_0023b841:
              prop_00 = (anon_struct_8_0_00000001_for___align)0x41;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_420,0,(char *)local_418._0_8_,0x3e134e);
              local_428._0_4_ = 6;
            }
          }
          else {
            local_428._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_4b8._16_8_ != local_498) {
          operator_delete((void *)local_4b8._16_8_,local_498[0] + 1);
        }
        iVar6 = 0;
        if (((ulong)local_428 & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_0023b2b0:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_428._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(&local_2b0,0x1149);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_590._0_8_ = &local_580;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_590,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)&stack0xfffffffffffffa48,(fmt *)local_590,
                       (string *)"outputs:result",(char (*) [15])&local_420,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00)
            ;
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_2b0,in_stack_fffffffffffffa48._M_p,
                                (long)local_5b0._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa48._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5a8) {
              operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
            }
            uVar3 = local_568._40_8_;
            if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
              operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
            }
            if ((string *)uVar3 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar9 = (long *)::std::__cxx11::string::_M_append(local_590,*(ulong *)uVar3);
              pTVar1 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(plVar9 + 2);
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*plVar9 == pTVar1) {
                local_5a8._0_8_ = (pTVar1->_metas).interpolation;
                local_5a8._8_8_ = plVar9[3];
                in_stack_fffffffffffffa48._M_p = (pointer)local_5a8;
              }
              else {
                local_5a8._0_8_ = (pTVar1->_metas).interpolation;
                in_stack_fffffffffffffa48._M_p = (pointer)*plVar9;
              }
              local_5b0._M_p = (pointer)plVar9[1];
              *plVar9 = (long)pTVar1;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar3,(string *)&stack0xfffffffffffffa48);
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa48._M_p !=
                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5a8) {
                operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
              }
              if ((anon_struct_8_0_00000001_for___align *)local_590._0_8_ != &local_580) {
                operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
            iVar6 = 1;
            goto LAB_0023b2b0;
          }
        }
        if ((undefined1 *)local_420 != local_418 + 8) {
          operator_delete((void *)local_420,local_418._8_8_ + 1);
        }
        if (!bVar5) goto LAB_0023bc59;
        cVar10 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f8,(key_type *)__k);
        if (cVar10._M_node == (_Base_ptr)(local_4f8 + 8)) {
          pmVar11 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_4c0,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar11);
          (pmVar11->_attrib)._varying_authored = (bool)p_Var14[3].field_0x4;
          (pmVar11->_attrib)._variability = p_Var14[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var14[4]._M_parent);
          (pmVar11->_attrib)._var._blocked = SUB41(p_Var14[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar11->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var14[5]._M_parent);
          (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var14[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar11->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var14[6]._M_parent);
          AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var14 + 7));
          *(_Base_ptr *)&pmVar11->_listOpQual = p_Var14[0x17]._M_parent;
          (pmVar11->_rel).type = *(Type *)&p_Var14[0x17]._M_left;
          Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var14[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar11->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var14[0x1e]._M_parent);
          (pmVar11->_rel).listOpQual = p_Var14[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var14[0x1f]._M_parent);
          (pmVar11->_rel)._varying_authored = *(bool *)&p_Var14[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
          pmVar11->_has_custom = *(bool *)&p_Var14[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_4f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar10 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f8,(key_type *)__k);
        if (cVar10._M_node == (_Base_ptr)(local_4f8 + 8)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(&local_2b0,0x114b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_428,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_2b0,(char *)local_428,local_420);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if (local_428 != (undefined1  [8])local_418) {
            operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
          }
          uVar3 = local_568._40_8_;
          if ((string *)local_508._8_8_ != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar12 = (long *)::std::__cxx11::string::_M_append
                                        (&stack0xfffffffffffffa48,*(ulong *)uVar3);
            plVar9 = plVar12 + 2;
            if ((long *)*plVar12 == plVar9) {
              local_418._0_8_ = *plVar9;
              local_418._8_8_ = plVar12[3];
              local_428 = (undefined1  [8])local_418;
            }
            else {
              local_418._0_8_ = *plVar9;
              local_428 = (undefined1  [8])*plVar12;
            }
            local_420 = plVar12[1];
            *plVar12 = (long)plVar9;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_508._8_8_,(string *)local_428);
            if (local_428 != (undefined1  [8])local_418) {
              operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
            }
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa48._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5a8) {
              operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._0_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
        }
      }
      else {
LAB_0023bc59:
        if ((iVar6 != 3) && (iVar6 != 0)) {
          bVar5 = false;
          goto LAB_0023bdde;
        }
      }
      p_Var14 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
    } while (p_Var14 != (_Base_ptr)local_4b8._8_8_);
    bVar5 = true;
  }
LAB_0023bdde:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4f8,(_Link_type)local_4f8._16_8_);
  return bVar5;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_string>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_string *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_string,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_string, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_string, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}